

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

target_ulong helper_lsl_x86_64(CPUX86State *env,target_ulong selector1)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  uint32_t e2;
  uint32_t e1;
  uint local_20;
  ushort local_1c [2];
  
  uVar1 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  if ((selector1 & 0xfffc) != 0) {
    iVar2 = load_segment_ra(env,(uint32_t *)local_1c,&local_20,(uint)selector1 & 0xffff,
                            unaff_retaddr);
    if (iVar2 == 0) {
      uVar6 = (uint)selector1 & 3;
      uVar3 = local_20 >> 0xd & 3;
      uVar4 = env->hflags & 3;
      if ((local_20 >> 0xc & 1) == 0) {
        uVar5 = local_20 >> 8 & 0xf;
        if ((uVar5 < 0xc) && (((0xa0eU >> uVar5 & 1) != 0 && (uVar4 <= uVar3 && uVar6 <= uVar3)))) {
LAB_004da205:
          uVar4 = local_20 & 0xf0000 | (uint)local_1c[0];
          uVar3 = uVar4 << 0xc | 0xfff;
          if ((local_20 >> 0x17 & 1) == 0) {
            uVar3 = uVar4;
          }
          env->cc_src = (ulong)(uVar1 | 0x40);
          return (ulong)uVar3;
        }
      }
      else if (((~local_20 & 0xc00) == 0) || (uVar6 <= uVar3 && uVar4 <= uVar3)) goto LAB_004da205;
    }
  }
  env->cc_src = (ulong)(uVar1 & 0xffffffbf);
  return 0;
}

Assistant:

target_ulong helper_lsl(CPUX86State *env, target_ulong selector1)
{
    unsigned int limit;
    uint32_t e1, e2, eflags, selector;
    int rpl, dpl, cpl, type;

    selector = selector1 & 0xffff;
    eflags = cpu_cc_compute_all(env, CC_OP);
    if ((selector & 0xfffc) == 0) {
        goto fail;
    }
    if (load_segment_ra(env, &e1, &e2, selector, GETPC()) != 0) {
        goto fail;
    }
    rpl = selector & 3;
    dpl = (e2 >> DESC_DPL_SHIFT) & 3;
    cpl = env->hflags & HF_CPL_MASK;
    if (e2 & DESC_S_MASK) {
        if ((e2 & DESC_CS_MASK) && (e2 & DESC_C_MASK)) {
            /* conforming */
        } else {
            if (dpl < cpl || dpl < rpl) {
                goto fail;
            }
        }
    } else {
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        switch (type) {
        case 1:
        case 2:
        case 3:
        case 9:
        case 11:
            break;
        default:
            goto fail;
        }
        if (dpl < cpl || dpl < rpl) {
        fail:
            CC_SRC = eflags & ~CC_Z;
            return 0;
        }
    }
    limit = get_seg_limit(e1, e2);
    CC_SRC = eflags | CC_Z;
    return limit;
}